

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O0

void __thiscall HdlcAnalyzer::ProcessAddressField(HdlcAnalyzer *this,HdlcByte byteAfterFlag)

{
  U8 mFlags;
  HdlcByte HVar1;
  element_type *peVar2;
  element_type *peVar3;
  HdlcByte local_b8;
  int local_a0;
  byte local_99;
  undefined1 local_98 [7];
  U8 lsbBit;
  Frame frame_1;
  U64 UStack_68;
  U8 flag_1;
  HdlcByte addressByte;
  int i;
  undefined1 local_40 [8];
  Frame frame;
  U8 flag;
  HdlcAnalyzer *this_local;
  
  HVar1 = byteAfterFlag;
  if ((this->mAbortFrame & 1U) == 0) {
    peVar2 = std::auto_ptr<HdlcAnalyzerSettings>::operator->(&this->mSettings);
    if (peVar2->mHdlcAddr == HDLC_BASIC_ADDRESS_FIELD) {
      CreateFrame((HdlcAnalyzer *)local_40,(U8)this,1,byteAfterFlag.startSample,
                  byteAfterFlag.endSample,(ulong)byteAfterFlag.value,'\0');
      AddFrameToResults(this,(Frame *)local_40);
      peVar3 = std::auto_ptr<HdlcAnalyzerResults>::operator->(&this->mResults);
      std::auto_ptr<HdlcAnalyzerSettings>::operator->(&this->mSettings);
      AnalyzerResults::AddMarker((ulonglong)peVar3,local_40._0_4_,(Channel *)0x8);
      Frame::~Frame((Frame *)local_40);
    }
    else {
      UStack_68 = byteAfterFlag.startSample;
      addressByte.startSample = byteAfterFlag.endSample;
      addressByte.endSample._0_1_ = byteAfterFlag.value;
      addressByte.endSample._1_1_ = byteAfterFlag.escaped;
      addressByte.endSample._2_6_ = byteAfterFlag._18_6_;
      peVar3 = std::auto_ptr<HdlcAnalyzerResults>::operator->(&this->mResults);
      std::auto_ptr<HdlcAnalyzerSettings>::operator->(&this->mSettings);
      AnalyzerResults::AddMarker((ulonglong)peVar3,(MarkerType)HVar1.startSample,(Channel *)0x8);
      mFlags = '\0';
      do {
        CreateFrame((HdlcAnalyzer *)local_98,(U8)this,2,UStack_68,addressByte.startSample,
                    addressByte.endSample & 0xff,mFlags);
        AddFrameToResults(this,(Frame *)local_98);
        local_99 = (byte)addressByte.endSample & 1;
        if ((addressByte.endSample & 1) == 0) {
          local_a0 = 1;
        }
        else {
          ReadByte(&local_b8,this);
          UStack_68 = local_b8.startSample;
          addressByte.startSample = local_b8.endSample;
          addressByte.endSample._0_1_ = local_b8.value;
          addressByte.endSample._1_1_ = local_b8.escaped;
          addressByte.endSample._2_6_ = local_b8._18_6_;
          if ((this->mAbortFrame & 1U) == 0) {
            local_a0 = 0;
          }
          else {
            local_a0 = 1;
          }
        }
        Frame::~Frame((Frame *)local_98);
        mFlags = mFlags + '\x01';
      } while (local_a0 == 0);
    }
  }
  return;
}

Assistant:

void HdlcAnalyzer::ProcessAddressField( HdlcByte byteAfterFlag )
{
    if( mAbortFrame )
    {
        return;
    }

    if( mSettings->mHdlcAddr == HDLC_BASIC_ADDRESS_FIELD )
    {
        U8 flag = ( byteAfterFlag.escaped ) ? HDLC_ESCAPED_BYTE : 0;
        Frame frame =
            CreateFrame( HDLC_FIELD_BASIC_ADDRESS, byteAfterFlag.startSample, byteAfterFlag.endSample, byteAfterFlag.value, 0, flag );
        AddFrameToResults( frame );

        // Put a marker in the beggining of the HDLC frame
        mResults->AddMarker( frame.mStartingSampleInclusive, AnalyzerResults::Start, mSettings->mInputChannel );
    }
    else // HDLC_EXTENDED_ADDRESS_FIELD
    {
        int i = 0;
        HdlcByte addressByte = byteAfterFlag;
        // Put a marker in the beggining of the HDLC frame
        mResults->AddMarker( addressByte.startSample, AnalyzerResults::Start, mSettings->mInputChannel );
        for( ;; )
        {
            U8 flag = ( addressByte.escaped ) ? HDLC_ESCAPED_BYTE : 0;
            Frame frame =
                CreateFrame( HDLC_FIELD_EXTENDED_ADDRESS, addressByte.startSample, addressByte.endSample, addressByte.value, i++, flag );
            AddFrameToResults( frame );

            U8 lsbBit = addressByte.value & 0x01;
            if( !lsbBit ) // End of Extended Address Field?
            {
                return;
            }

            // Next address byte
            addressByte = ReadByte();
            if( mAbortFrame )
            {
                return;
            }
        }
    }
}